

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoMode.cpp
# Opt level: O2

vector<sf::VideoMode,_std::allocator<sf::VideoMode>_> * sf::VideoMode::getFullscreenModes(void)

{
  int iVar1;
  _Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_> local_20;
  
  if (getFullscreenModes()::modes == '\0') {
    iVar1 = __cxa_guard_acquire(&getFullscreenModes()::modes);
    if (iVar1 != 0) {
      getFullscreenModes::modes.super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      getFullscreenModes::modes.super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      getFullscreenModes::modes.super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __cxa_atexit(std::vector<sf::VideoMode,_std::allocator<sf::VideoMode>_>::~vector,
                   &getFullscreenModes::modes,&__dso_handle);
      __cxa_guard_release(&getFullscreenModes()::modes);
    }
  }
  if (getFullscreenModes::modes.super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      getFullscreenModes::modes.super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    priv::VideoModeImpl::getFullscreenModes();
    std::vector<sf::VideoMode,_std::allocator<sf::VideoMode>_>::_M_move_assign
              (&getFullscreenModes::modes,&local_20);
    std::_Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>::~_Vector_base(&local_20);
    std::
    __sort<__gnu_cxx::__normal_iterator<sf::VideoMode*,std::vector<sf::VideoMode,std::allocator<sf::VideoMode>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<sf::VideoMode>>>
              (getFullscreenModes::modes.
               super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>._M_impl.
               super__Vector_impl_data._M_start,
               getFullscreenModes::modes.
               super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  return &getFullscreenModes::modes;
}

Assistant:

const std::vector<VideoMode>& VideoMode::getFullscreenModes()
{
    static std::vector<VideoMode> modes;

    // Populate the array on first call
    if (modes.empty())
    {
        modes = priv::VideoModeImpl::getFullscreenModes();
        std::sort(modes.begin(), modes.end(), std::greater<VideoMode>());
    }

    return modes;
}